

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O2

void __thiscall embree::TutorialApplication::displayFunc(TutorialApplication *this)

{
  Camera *this_00;
  Averaged<double> *this_01;
  float fVar1;
  PerspectiveCameraNode *pPVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ostream *poVar6;
  int64_t iVar7;
  ImDrawData *draw_data;
  TutorialApplication *pTVar8;
  float fVar9;
  double local_210;
  string local_1f8 [32];
  ostringstream stream;
  _Alloc_hider _Stack_1d0;
  undefined1 local_1c8 [32];
  float local_1a8;
  ISPCCamera ispccamera;
  
  dVar3 = getSeconds();
  if (g_motion_blur == true) {
    fVar9 = (float)(dVar3 - this->time0);
  }
  else if (this->animate == true) {
    fVar9 = sinf(ABS((float)(dVar3 - this->time0)));
    fVar9 = fVar9 * 0.5 + 0.5;
  }
  else {
    fVar9 = this->render_time;
  }
  this_00 = &this->camera;
  fVar1 = this->speed;
  Camera::move(this_00,(this->moveDelta).field_0.field_0.x * fVar1,
               (this->moveDelta).field_0.field_0.y * fVar1,
               fVar1 * (this->moveDelta).field_0.field_0.z);
  pPVar2 = (this->animated_camera).ptr;
  if (pPVar2 != (PerspectiveCameraNode *)0x0) {
    (*(pPVar2->super_Node).super_RefCount._vptr_RefCount[0x10])(fVar9,&stream);
    *(pointer *)&(this->camera).from.field_0 = _stream;
    *(pointer *)((long)&(this->camera).from.field_0 + 8) = _Stack_1d0._M_p;
    *(undefined8 *)&(this->camera).to.field_0 = local_1c8._0_8_;
    *(undefined8 *)((long)&(this->camera).to.field_0 + 8) = local_1c8._8_8_;
    *(undefined8 *)&(this->camera).up.field_0 = local_1c8._16_8_;
    *(undefined8 *)((long)&(this->camera).up.field_0 + 8) = local_1c8._24_8_;
    (this->camera).fov = local_1a8;
  }
  pTVar8 = (TutorialApplication *)&ispccamera;
  Camera::getISPCCamera((ISPCCamera *)pTVar8,this_00,(ulong)this->width,(ulong)this->height);
  if (this->print_camera == true) {
    Camera::str_abi_cxx11_((string *)&stream,this_00);
    poVar6 = std::operator<<((ostream *)&std::cout,(string *)&stream);
    std::endl<char,std::char_traits<char>>(poVar6);
    pTVar8 = (TutorialApplication *)&stream;
    std::__cxx11::string::~string((string *)pTVar8);
  }
  initRayStats(pTVar8);
  (*(this->super_Application)._vptr_Application[0xb])
            (fVar9,this,this->pixels,(ulong)this->width,(ulong)this->height,&ispccamera);
  dVar4 = getSeconds();
  local_210 = (double)ispccamera.render_time;
  if ((ispccamera.render_time == 0.0) && (!NAN(ispccamera.render_time))) {
    local_210 = dVar4 - dVar3;
  }
  this_01 = &this->avg_render_time;
  pTVar8 = (TutorialApplication *)this_01;
  Averaged<double>::add(this_01,local_210);
  iVar7 = getNumRays(pTVar8);
  dVar4 = (double)iVar7 / (local_210 * 1000000.0);
  Averaged<double>::add(&this->avg_mrayps,dVar4);
  glRasterPos2i(0xffffffffffffffff,1);
  glPixelZoom(0x3f800000,0xbf800000);
  glDrawPixels(this->width,this->height,0x1908,0x1401,this->pixels);
  ImGui_ImplOpenGL2_NewFrame();
  ImGui_ImplGlfw_NewFrame();
  ImGui::NewFrame();
  ImGui::SetNextWindowBgAlpha(0.3);
  ImGui::Begin("Embree",(bool *)0x0,1);
  (*(this->super_Application)._vptr_Application[10])(this);
  dVar5 = Averaged<double>::get(this_01);
  ImGui::Text("Render: %3.2f fps",-(uint)(dVar5 != 0.0) & SUB84(1.0 / dVar5,0));
  dVar5 = Averaged<double>::get(&this->avg_frame_time);
  ImGui::Text("Total: %3.2f fps",-(uint)(dVar5 != 0.0) & SUB84(1.0 / dVar5,0));
  dVar5 = Averaged<double>::get(&this->avg_mrayps);
  ImGui::Text("%3.2f Mray/s",SUB84(dVar5,0));
  ImGui::End();
  ImGui::Render();
  draw_data = ImGui::GetDrawData();
  ImGui_ImplOpenGL2_RenderDrawData(draw_data);
  glfwSwapBuffers(this->window);
  dVar5 = getSeconds();
  dVar5 = dVar5 - dVar3;
  Averaged<double>::add(&this->avg_frame_time,dVar5);
  if (this->print_frame_rate == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
    *(uint *)(local_1c8 + *(long *)(_stream + -0x18) + 8) =
         *(uint *)(local_1c8 + *(long *)(_stream + -0x18) + 8) & 0xfffffefb | 4;
    *(undefined8 *)((long)&_Stack_1d0._M_p + *(long *)(_stream + -0x18)) = 2;
    std::operator<<((ostream *)&stream,"render: ");
    poVar6 = std::ostream::_M_insert<double>(1.0 / local_210);
    std::operator<<(poVar6," fps, ");
    poVar6 = std::ostream::_M_insert<double>(local_210 * 1000.0);
    std::operator<<(poVar6," ms, ");
    poVar6 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar6," Mray/s, ");
    std::operator<<((ostream *)&stream,"total: ");
    poVar6 = std::ostream::_M_insert<double>(1.0 / dVar5);
    std::operator<<(poVar6," fps, ");
    poVar6 = std::ostream::_M_insert<double>(dVar5 * 1000.0);
    std::operator<<(poVar6," ms, ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&stream);
    poVar6 = std::operator<<(poVar6,"x");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::operator<<(poVar6," pixels");
    std::__cxx11::stringbuf::str();
    poVar6 = std::operator<<((ostream *)&std::cout,local_1f8);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stream);
  }
  return;
}

Assistant:

void TutorialApplication::displayFunc()
  {
    double t0 = getSeconds();
    const float time = g_motion_blur ? float(t0-time0) : (animate ? 0.5 * sinf(fabsf(float(t0-time0))) + 0.5 : render_time);
    
    /* update camera */
    camera.move(moveDelta.x*speed, moveDelta.y*speed, moveDelta.z*speed);

    /* update animated camera */
    if (animated_camera)
      camera = Camera(animated_camera->get(time),camera.handedness);
    
    ISPCCamera ispccamera = camera.getISPCCamera(width,height);
     if (print_camera)
      std::cout << camera.str() << std::endl;

    /* render image using ISPC */
    initRayStats();
    render(pixels,width,height,time,ispccamera);
    double dt0 = getSeconds()-t0;
    if (ispccamera.render_time != 0.0) dt0 = ispccamera.render_time;
    avg_render_time.add(dt0);
    double mrayps = double(getNumRays())/(1000000.0*dt0);
    avg_mrayps.add(mrayps);

    /* draw pixels to screen */
    glRasterPos2i(-1,1);
    glPixelZoom(1.0f,-1.0f);
    glDrawPixels(width,height,GL_RGBA,GL_UNSIGNED_BYTE,pixels);

    // Start the Dear ImGui frame
    ImGui_ImplOpenGL2_NewFrame();
    ImGui_ImplGlfw_NewFrame();
    ImGui::NewFrame();
    
    ImGuiWindowFlags window_flags = 0;
    window_flags |= ImGuiWindowFlags_NoTitleBar;
    //window_flags |= ImGuiWindowFlags_NoScrollbar;
    //window_flags |= ImGuiWindowFlags_MenuBar;
    //window_flags |= ImGuiWindowFlags_NoMove;
    //window_flags |= ImGuiWindowFlags_NoResize;
    //window_flags |= ImGuiWindowFlags_NoCollapse;
    //window_flags |= ImGuiWindowFlags_NoNav;

    //ImGui::GetStyle().WindowBorderSize = 0.0f;
    //ImGui::SetNextWindowPos(ImVec2(width-200,0));
    //ImGui::SetNextWindowSize(ImVec2(200,height));
    ImGui::SetNextWindowBgAlpha(0.3f);
    ImGui::Begin("Embree", nullptr, window_flags);
    drawGUI();
    
    double render_dt = avg_render_time.get();
    double render_fps = render_dt != 0.0 ? 1.0f/render_dt : 0.0;
    ImGui::Text("Render: %3.2f fps",render_fps);

    double total_dt = avg_frame_time.get();
    double total_fps = total_dt != 0.0 ? 1.0f/total_dt : 0.0;
    ImGui::Text("Total: %3.2f fps",total_fps);

#if defined(RAY_STATS) && !defined(EMBREE_SYCL_TUTORIAL)
    ImGui::Text("%3.2f Mray/s",avg_mrayps.get());
#endif
    ImGui::End();
     
    //ImGui::ShowDemoWindow();
        
    ImGui::Render();
    ImGui_ImplOpenGL2_RenderDrawData(ImGui::GetDrawData());
    
    glfwSwapBuffers(window);

#ifdef __APPLE__
    // work around glfw issue #1334
    // https://github.com/glfw/glfw/issues/1334
    static bool macMoved = false;

    if (!macMoved) {
      int x, y;
      glfwGetWindowPos(window, &x, &y);
      glfwSetWindowPos(window, ++x, y);
      macMoved = true;
    }
#endif

    double dt1 = getSeconds()-t0;
    avg_frame_time.add(dt1);

    if (print_frame_rate)
    {
      std::ostringstream stream;
      stream.setf(std::ios::fixed, std::ios::floatfield);
      stream.precision(2);
      stream << "render: ";
      stream << 1.0f/dt0 << " fps, ";
      stream << dt0*1000.0f << " ms, ";
#if defined(RAY_STATS) && !defined(EMBREE_SYCL_TUTORIAL)
      stream << mrayps << " Mray/s, ";
#endif
      stream << "total: ";
      stream << 1.0f/dt1 << " fps, ";
      stream << dt1*1000.0f << " ms, ";
      stream << width << "x" << height << " pixels";
      std::cout << stream.str() << std::endl;
    } 
  }